

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::absI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  Literal *in_RDX;
  long lVar1;
  Literal *this_01;
  undefined1 local_a0 [8];
  LaneArray<4> lanes;
  
  getLanes<int,4>((LaneArray<4> *)local_a0,(wasm *)this,in_RDX);
  this_00 = &lanes._M_elems[3].type;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    this_01 = (Literal *)(local_a0 + lVar1);
    abs((Literal *)this_00,(int)this_01);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)local_a0);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::absI32x4() const {
  return unary<4, &Literal::getLanesI32x4, &Literal::abs>(*this);
}